

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeBaseAddSubImm(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint ImmVal;
  uint ShifterVal;
  uint Datasize;
  uint S;
  uint Imm;
  uint Rn;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  uVar1 = fieldFromInstruction(insn,10,0xe);
  uVar2 = fieldFromInstruction(insn,0x1d,1);
  uVar3 = fieldFromInstruction(insn,0x1f,1);
  uVar4 = uVar1 >> 0xc & 3;
  if ((uVar4 == 0) || (uVar4 == 1)) {
    if (uVar3 == 0) {
      if ((RegNo == 0x1f) && (uVar2 == 0)) {
        DecodeGPR32spRegisterClass(Inst,0x1f,Addr,Decoder);
      }
      else {
        DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
      }
      DecodeGPR32spRegisterClass(Inst,RegNo_00,Addr,Decoder);
    }
    else {
      if ((RegNo == 0x1f) && (uVar2 == 0)) {
        DecodeGPR64spRegisterClass(Inst,0x1f,Addr,Decoder);
      }
      else {
        DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      }
      DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
    }
    MCOperand_CreateImm0(Inst,(ulong)(uVar1 & 0xfff));
    MCOperand_CreateImm0(Inst,(ulong)(uVar4 * 0xc));
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeBaseAddSubImm(MCInst *Inst, uint32_t insn,
		uint64_t Addr, void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Imm = fieldFromInstruction(insn, 10, 14);
	unsigned S = fieldFromInstruction(insn, 29, 1);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);

	unsigned ShifterVal = (Imm >> 12) & 3;
	unsigned ImmVal = Imm & 0xFFF;

	if (ShifterVal != 0 && ShifterVal != 1)
		return Fail;

	if (Datasize) {
		if (Rd == 31 && !S)
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	} else {
		if (Rd == 31 && !S)
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
	}

	//if (!Dis->tryAddingSymbolicOperand(Inst, Imm, Addr, Fail, 0, 4))
	MCOperand_CreateImm0(Inst, ImmVal);
	MCOperand_CreateImm0(Inst, 12 * ShifterVal);
	return Success;
}